

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

void __thiscall Apt::ProjectPosOnStartupPath(Apt *this,positionTy *_pos,StartupLoc *_startLoc)

{
  double dVar1;
  double ln_x1;
  double ln_y1;
  double dVar2;
  double dVar3;
  double base_y;
  double base_x;
  double local_58;
  double local_50;
  distToLineTy local_48;
  
  _pos->_head = _startLoc->heading;
  _pos->f = (posFlagsTy)((ushort)*(undefined4 *)&_pos->f & 0xcf7f | 0x1080);
  _pos->_alt = NAN;
  local_48.dist2 = NAN;
  local_48.len2 = NAN;
  local_48.leg1_len2 = NAN;
  local_48.leg2_len2 = NAN;
  dVar2 = (_startLoc->super_TaxiNode).lon;
  dVar3 = _pos->_lon;
  dVar1 = _pos->_lat;
  dVar1 = cos(((double)(-(ulong)(dVar1 <= 180.0) & (ulong)dVar1 |
                       ~-(ulong)(dVar1 <= 180.0) & (ulong)(dVar1 + -360.0)) * 3.141592653589793) /
              180.0);
  ln_x1 = dVar1 * 111132.95 * (dVar2 - dVar3);
  dVar2 = _pos->_lat;
  dVar3 = (_startLoc->viaPos).x;
  ln_y1 = ((_startLoc->super_TaxiNode).lat - dVar2) * 111132.95;
  dVar1 = _pos->_lon;
  dVar2 = cos(((double)(-(ulong)(dVar2 <= 180.0) & (ulong)dVar2 |
                       ~-(ulong)(dVar2 <= 180.0) & (ulong)(dVar2 + -360.0)) * 3.141592653589793) /
              180.0);
  dVar2 = dVar2 * 111132.95 * (dVar3 - dVar1);
  dVar3 = ((_startLoc->viaPos).y - _pos->_lat) * 111132.95;
  DistPointToLineSqr(0.0,0.0,ln_x1,ln_y1,dVar2,dVar3,&local_48);
  if (local_48.leg2_len2 <= local_48.len2) {
    local_50 = NAN;
    local_58 = NAN;
    DistResultToBaseLoc(ln_x1,ln_y1,dVar2,dVar3,&local_48,&local_50,&local_58);
    dVar3 = local_50;
    dVar2 = _pos->_lat;
    dVar2 = cos(((double)(~-(ulong)(dVar2 <= 180.0) & (ulong)(dVar2 + -360.0) |
                         (ulong)dVar2 & -(ulong)(dVar2 <= 180.0)) * 3.141592653589793) / 180.0);
    dVar2 = dVar3 / (dVar2 * 111132.95) + _pos->_lon;
    _pos->_lat = local_58 / 111132.95 + _pos->_lat;
  }
  else {
    _pos->_lat = (_startLoc->super_TaxiNode).lat;
    dVar2 = (_startLoc->super_TaxiNode).lon;
  }
  _pos->_lon = dVar2;
  return;
}

Assistant:

void ProjectPosOnStartupPath (positionTy& _pos, const StartupLoc& _startLoc)
    {
        // One thing is for sure: the heading must match startup location
        _pos.heading() = _startLoc.heading;
        _pos.f.bHeadFixed = true;
        _pos.f.specialPos = SPOS_STARTUP;
        // And the altitude needs re-comupting
        _pos.alt_m() = NAN;
        
        // Compute temporary "coordinates" in meters, relative to the search position
        distToLineTy dist;
        const double start_x = Lon2Dist(_startLoc.lon      - _pos.lon(), _pos.lat());   // x is eastward
        const double start_y = Lat2Dist(_startLoc.lat      - _pos.lat());               // y is northward
        const double via_x   = Lon2Dist(_startLoc.viaPos.x - _pos.lon(), _pos.lat());
        const double via_y   = Lat2Dist(_startLoc.viaPos.y - _pos.lat());
        DistPointToLineSqr(0.0, 0.0, start_x, start_y, via_x, via_y, dist);
        
        // We don't want the plane to crash into the gate, so we stop the plane
        // at the startup location
        if (dist.leg2_len2 > dist.len2)             // is base beyond startup location?
        {
            _pos.lat() = _startLoc.lat;
            _pos.lon() = _startLoc.lon;
        } else {
            // otherwise move to projection on the path to the startup location
            double base_x = NAN, base_y = NAN;
            DistResultToBaseLoc(start_x, start_y,
                                via_x, via_y,
                                dist, base_x, base_y);
            _pos.lon() += Dist2Lon(base_x, _pos.lat());
            _pos.lat() += Dist2Lat(base_y);
        }
    }